

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_new_section(parse_state *state,int kw,int nargs,char **args)

{
  void *pvVar1;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  char **in_stack_ffffffffffffffc8;
  parse_state *state_00;
  
  if (in_EDX < 2) {
    state_00 = (parse_state *)0x10dc2a;
  }
  else {
    state_00 = (parse_state *)in_RCX[1];
  }
  printf("[ %s %s ]\n",*in_RCX,state_00);
  if (in_ESI == 0x15) {
    pvVar1 = parse_action(state_00,0x15,in_stack_ffffffffffffffc8);
    *(void **)(in_RDI + 0x18) = pvVar1;
    if (*(long *)(in_RDI + 0x18) != 0) {
      *(code **)(in_RDI + 0x20) = parse_line_action;
      return;
    }
  }
  else if (in_ESI == 0x19) {
    pvVar1 = parse_service(state_00,0x19,in_stack_ffffffffffffffc8);
    *(void **)(in_RDI + 0x18) = pvVar1;
    if (*(long *)(in_RDI + 0x18) != 0) {
      *(code **)(in_RDI + 0x20) = parse_line_service;
      return;
    }
  }
  *(code **)(in_RDI + 0x20) = parse_line_no_op;
  return;
}

Assistant:

void parse_new_section(struct parse_state *state, int kw,
                       int nargs, char **args)
{
    printf("[ %s %s ]\n", args[0],
           nargs > 1 ? args[1] : "");
    switch(kw) {
    case K_service:
        state->context = parse_service(state, nargs, args);
        if (state->context) {
            state->parse_line = parse_line_service;
            return;
        }
        break;
    case K_on:
        state->context = parse_action(state, nargs, args);
        if (state->context) {
            state->parse_line = parse_line_action;
            return;
        }
        break;
    }
    state->parse_line = parse_line_no_op;
}